

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

StatusOr<google::protobuf::FeatureResolver> *
google::protobuf::FeatureResolver::Create
          (StatusOr<google::protobuf::FeatureResolver> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *compiled_defaults)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Edition edition_00;
  void *pvVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  Rep *pRVar6;
  FeatureSet *from;
  undefined1 *puVar7;
  Edition EVar8;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *pRVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string_view message;
  Status _status;
  StatusOr<google::protobuf::FeatureSet> features;
  Status local_180;
  Edition local_174;
  void **local_170;
  StringifySink local_168;
  StringifySink local_148;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 local_128;
  char *local_120;
  long local_118 [8];
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 local_d8;
  char *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  undefined8 local_b8;
  char *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  undefined8 local_98;
  char *local_90;
  FeatureSet local_80;
  
  EVar8 = (compiled_defaults->field_0)._impl_.minimum_edition_;
  if ((int)edition < (int)EVar8) {
    (anonymous_namespace)::
    Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)&local_d8.status_,"Edition ",edition,
               " is earlier than the minimum supported edition ",EVar8);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
               &local_d8.status_);
    if (((ulong)local_d8 & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_d8);
    }
  }
  else {
    EVar8 = (compiled_defaults->field_0)._impl_.maximum_edition_;
    if ((int)EVar8 < (int)edition) {
      (anonymous_namespace)::
      Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
                ((_anonymous_namespace_ *)&local_d8.status_,"Edition ",edition,
                 " is later than the maximum supported edition ",EVar8);
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
      StatusOrData<absl::lts_20250127::Status,_0>
                (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
                 &local_d8.status_);
      if (((ulong)local_d8 & 1) == 0) {
        absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_d8);
      }
    }
    else {
      this = &(compiled_defaults->field_0)._impl_.defaults_;
      pRVar9 = this;
      local_174 = edition;
      if ((undefined1  [40])((undefined1  [40])compiled_defaults->field_0 & (undefined1  [40])0x1)
          != (undefined1  [40])0x0) {
        pRVar6 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
        pRVar9 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
                 pRVar6->elements;
        if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar6 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
          this = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
                 pRVar6->elements;
        }
      }
      local_170 = &(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                  *(int *)((long)&compiled_defaults->field_0 + 0x10);
      if (pRVar9 != (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                     *)local_170) {
        EVar8 = EDITION_UNKNOWN;
        do {
          pvVar3 = (pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
          edition_00 = *(Edition *)((long)pvVar3 + 0x28);
          if (edition_00 == EDITION_UNKNOWN) {
            (anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
                      ((_anonymous_namespace_ *)&local_d8.status_,"Invalid edition ",EDITION_UNKNOWN
                       ," specified.");
            absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
            StatusOrData<absl::lts_20250127::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureResolver>,&local_d8.status_);
            if (((ulong)local_d8 & 1) != 0) {
              return __return_storage_ptr__;
            }
            absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_d8);
            return __return_storage_ptr__;
          }
          if ((int)edition_00 <= (int)EVar8 && EVar8 != EDITION_UNKNOWN) {
            paVar1 = &local_148.buffer_.field_2;
            local_148.buffer_.field_2._M_allocated_capacity = 0;
            local_148.buffer_.field_2._8_8_ = 0;
            local_148.buffer_._M_string_length = 0;
            local_148.buffer_._M_dataplus._M_p = (pointer)paVar1;
            AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_148,EVar8);
            sVar5 = local_148.buffer_._M_string_length;
            _Var4._M_p = local_148.buffer_._M_dataplus._M_p;
            paVar2 = &local_168.buffer_.field_2;
            local_168.buffer_.field_2._M_allocated_capacity = 0;
            local_168.buffer_.field_2._8_8_ = 0;
            local_168.buffer_._M_string_length = 0;
            local_168.buffer_._M_dataplus._M_p = (pointer)paVar2;
            AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
                      (&local_168,edition_00);
            local_d8 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)
                       0x3b;
            local_d0 = "Feature set defaults are not strictly increasing.  Edition ";
            local_c8 = sVar5;
            local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)_Var4._M_p;
            local_b8 = 0x25;
            local_b0 = " is greater than or equal to edition ";
            local_a8 = local_168.buffer_._M_string_length;
            local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_168.buffer_._M_dataplus._M_p;
            local_98 = 1;
            local_90 = ".";
            pieces._M_len = local_168.buffer_._M_string_length;
            pieces._M_array = (iterator)0x5;
            absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                      ((string *)&local_128.status_,(strings_internal *)&local_d8.status_,pieces);
            message._M_str = local_120;
            message._M_len = (size_t)&local_180;
            absl::lts_20250127::FailedPreconditionError(message);
            if (local_128 !=
                (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)local_118)
            {
              operator_delete((void *)local_128,local_118[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168.buffer_._M_dataplus._M_p != paVar2) {
              operator_delete(local_168.buffer_._M_dataplus._M_p,
                              local_168.buffer_.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148.buffer_._M_dataplus._M_p != paVar1) {
              operator_delete(local_148.buffer_._M_dataplus._M_p,
                              local_148.buffer_.field_2._M_allocated_capacity + 1);
            }
            absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
            StatusOrData<absl::lts_20250127::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureResolver>,&local_180);
            if ((local_180.rep_ & 1) != 0) {
              return __return_storage_ptr__;
            }
            absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_180.rep_);
            return __return_storage_ptr__;
          }
          puVar7 = *(undefined1 **)((long)pvVar3 + 0x20);
          if ((FeatureSet *)puVar7 == (FeatureSet *)0x0) {
            puVar7 = _FeatureSet_default_instance_;
          }
          FeatureSet::FeatureSet((FeatureSet *)&local_d8.status_,(Arena *)0x0,(FeatureSet *)puVar7);
          puVar7 = *(undefined1 **)((long)pvVar3 + 0x18);
          if ((MessageLite *)puVar7 == (MessageLite *)0x0) {
            puVar7 = _FeatureSet_default_instance_;
          }
          FeatureSet::MergeImpl((MessageLite *)&local_d8.status_,(MessageLite *)puVar7);
          anon_unknown_21::ValidateMergedFeatures
                    ((anon_unknown_21 *)&local_128.status_,(FeatureSet *)&local_d8.status_);
          if (local_128 !=
              (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1) {
            absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
            StatusOrData<const_absl::lts_20250127::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureResolver>,&local_128.status_);
            absl::lts_20250127::Status::~Status(&local_128.status_);
            FeatureSet::~FeatureSet((FeatureSet *)&local_d8.status_);
            return __return_storage_ptr__;
          }
          EVar8 = *(Edition *)((long)pvVar3 + 0x28);
          FeatureSet::~FeatureSet((FeatureSet *)&local_d8.status_);
          pRVar9 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                    *)&(pRVar9->super_RepeatedPtrFieldBase).current_size_;
        } while (pRVar9 != (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                            *)local_170);
      }
      internal::GetEditionFeatureSetDefaults
                ((StatusOr<google::protobuf::FeatureSet> *)&local_d8.status_,local_174,
                 compiled_defaults);
      local_128 = local_d8;
      if (((ulong)local_d8 & 1) == 0) {
        LOCK();
        *(int *)local_d8 = *(int *)local_d8 + 1;
        UNLOCK();
      }
      if (local_d8 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1)
      {
        from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::value
                         ((StatusOr<google::protobuf::FeatureSet> *)&local_d8.status_);
        FeatureSet::FeatureSet(&local_80,(Arena *)0x0,from);
        FeatureSet::FeatureSet((FeatureSet *)&local_128.status_,(Arena *)0x0,&local_80);
        FeatureSet::FeatureSet
                  (&(__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>).
                    field_1.data_.defaults_,(Arena *)0x0,(FeatureSet *)&local_128.status_);
        (__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>).field_0 =
             (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1)0x1;
        FeatureSet::~FeatureSet((FeatureSet *)&local_128.status_);
        FeatureSet::~FeatureSet(&local_80);
      }
      else {
        absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
        StatusOrData<const_absl::lts_20250127::Status,_0>
                  (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
                   &local_128.status_);
        absl::lts_20250127::Status::~Status(&local_128.status_);
      }
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
      ~StatusOrData((StatusOrData<google::protobuf::FeatureSet> *)&local_d8.status_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureResolver> FeatureResolver::Create(
    Edition edition, const FeatureSetDefaults& compiled_defaults) {
  if (edition < compiled_defaults.minimum_edition()) {
    return Error("Edition ", edition,
                 " is earlier than the minimum supported edition ",
                 compiled_defaults.minimum_edition());
  }
  if (compiled_defaults.maximum_edition() < edition) {
    return Error("Edition ", edition,
                 " is later than the maximum supported edition ",
                 compiled_defaults.maximum_edition());
  }

  // Validate compiled defaults.
  Edition prev_edition = EDITION_UNKNOWN;
  for (const auto& edition_default : compiled_defaults.defaults()) {
    if (edition_default.edition() == EDITION_UNKNOWN) {
      return Error("Invalid edition ", edition_default.edition(),
                   " specified.");
    }
    if (prev_edition != EDITION_UNKNOWN) {
      if (edition_default.edition() <= prev_edition) {
        return Error(
            "Feature set defaults are not strictly increasing.  Edition ",
            prev_edition, " is greater than or equal to edition ",
            edition_default.edition(), ".");
      }
    }
    FeatureSet features = edition_default.fixed_features();
    features.MergeFrom(edition_default.overridable_features());
    RETURN_IF_ERROR(ValidateMergedFeatures(features));

    prev_edition = edition_default.edition();
  }

  auto features =
      internal::GetEditionFeatureSetDefaults(edition, compiled_defaults);
  RETURN_IF_ERROR(features.status());
  return FeatureResolver(std::move(features.value()));
}